

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_long>::on_oct
          (int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_long> *this)

{
  uint uVar1;
  unsigned_long n;
  long lVar2;
  int iVar3;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> bVar4;
  basic_format_specs<char> *in_RDI;
  int unaff_retaddr;
  undefined1 in_stack_00000008 [16];
  buffer_appender<char> in_stack_00000018;
  anon_class_16_2_cb75083a_for_f_conflict in_stack_00000030;
  int num_digits;
  basic_format_specs<char> *specs;
  
  n._0_1_ = in_RDI[1].type;
  n._1_1_ = in_RDI[1].field_0x9;
  n._2_1_ = in_RDI[1].fill.data_[0];
  n._3_1_ = in_RDI[1].fill.data_[1];
  n._4_1_ = in_RDI[1].fill.data_[2];
  n._5_1_ = in_RDI[1].fill.data_[3];
  n._6_1_ = in_RDI[1].fill.size_;
  n._7_1_ = in_RDI[1].field_0xf;
  specs = in_RDI;
  iVar3 = count_digits<3u,unsigned_long>(n);
  if (((*(char *)((long)&(*(buffer<char> **)(in_RDI + 1))->ptr_ + 1) < '\0') &&
      (*(int *)((long)&(*(buffer<char> **)(in_RDI + 1))->_vptr_buffer + 4) <= iVar3)) &&
     (lVar2._0_1_ = in_RDI[1].type, lVar2._1_1_ = in_RDI[1].field_0x9,
     lVar2._2_1_ = in_RDI[1].fill.data_[0], lVar2._3_1_ = in_RDI[1].fill.data_[1],
     lVar2._4_1_ = in_RDI[1].fill.data_[2], lVar2._5_1_ = in_RDI[1].fill.data_[3],
     lVar2._6_1_ = in_RDI[1].fill.size_, lVar2._7_1_ = in_RDI[1].field_0xf, lVar2 != 0)) {
    uVar1 = in_RDI[2].precision;
    in_RDI[2].precision = uVar1 + 1;
    *(undefined1 *)
     ((long)&((basic_format_specs<char> *)(&in_RDI[2].fill + -2))->width + (ulong)uVar1) = 0x30;
  }
  get_prefix((int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_long> *)0x28cba4);
  bVar4.container =
       (buffer<char> *)
       write_int<fmt::v7::detail::buffer_appender<char>,char,fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,char,unsigned_long>::on_oct()::_lambda(fmt::v7::detail::buffer_appender<char>)_1_>
                 (in_stack_00000018,unaff_retaddr,(string_view)in_stack_00000008,specs,
                  in_stack_00000030);
  *(buffer<char> **)in_RDI = bVar4.container;
  return;
}

Assistant:

void on_oct() {
    int num_digits = count_digits<3>(abs_value);
    if (specs.alt && specs.precision <= num_digits && abs_value != 0) {
      // Octal prefix '0' is counted as a digit, so only add it if precision
      // is not greater than the number of digits.
      prefix[prefix_size++] = '0';
    }
    out = write_int(out, num_digits, get_prefix(), specs,
                    [this, num_digits](iterator it) {
                      return format_uint<3, Char>(it, abs_value, num_digits);
                    });
  }